

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O2

StreamException * __thiscall
Centaurus::Stream::toomany(StreamException *__return_storage_ptr__,Stream *this,int count)

{
  ostream *poVar1;
  ostringstream stream;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_line);
  poVar1 = std::operator<<(poVar1,", Pos ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_pos);
  poVar1 = std::operator<<(poVar1,": The number of rules exceeded ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::operator<<(poVar1,count);
  std::__cxx11::stringbuf::str();
  StreamException::StreamException(__return_storage_ptr__,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

StreamException toomany(int count)
    {
        std::ostringstream stream;

        stream << "Line " << m_line << ", Pos " << m_pos << ": The number of rules exceeded " << std::dec << count;

        return StreamException(stream.str());
    }